

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_quad_to_line<charls::transform_hp3<unsigned_short>,unsigned_short>
               (quad<unsigned_short> *source,size_t pixel_stride_in,unsigned_short *destination,
               size_t pixel_stride,transform_hp3<unsigned_short> *transform,uint32_t mask)

{
  quad<unsigned_short> qVar1;
  triplet<unsigned_short> triplet_value;
  quad<unsigned_short> *pqVar2;
  anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  quad<unsigned_short> color_transformed;
  quad<unsigned_short> color;
  size_t i;
  unsigned_long pixel_count;
  uint32_t mask_local;
  transform_hp3<unsigned_short> *transform_local;
  size_t pixel_stride_local;
  unsigned_short *destination_local;
  size_t pixel_stride_in_local;
  quad<unsigned_short> *source_local;
  
  transform_local = (transform_hp3<unsigned_short> *)pixel_stride;
  pixel_stride_local = (size_t)destination;
  destination_local = (unsigned_short *)pixel_stride_in;
  pixel_stride_in_local = (size_t)source;
  pqVar2 = (quad<unsigned_short> *)
           std::min<unsigned_long>
                     ((unsigned_long *)&transform_local,(unsigned_long *)&destination_local);
  qVar1 = *pqVar2;
  color.super_triplet<unsigned_short>.field_0 =
       (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)0x0;
  color.super_triplet<unsigned_short>.field_1 =
       (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)0x0;
  color.super_triplet<unsigned_short>.field_2 =
       (anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5)0x0;
  color.field_0 = (anon_union_2_2_7f9ecb5c_for_quad<unsigned_short>_2)0x0;
  for (; (ulong)color < (ulong)qVar1; color = (quad<unsigned_short>)((long)color + 1)) {
    color_transformed = *(quad<unsigned_short> *)(pixel_stride_in_local + (long)color * 8);
    triplet_value =
         transform_hp3<unsigned_short>::operator()
                   (transform,color_transformed.super_triplet<unsigned_short>.field_0.v1 & mask,
                    color_transformed.super_triplet<unsigned_short>.field_1.v2 & mask,
                    color_transformed.super_triplet<unsigned_short>.field_2.v3 & mask);
    quad<unsigned_short>::quad
              ((quad<unsigned_short> *)&local_58,triplet_value,color_transformed.field_0.v4 & mask);
    *(anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1 *)(pixel_stride_local + (long)color * 2)
         = local_58;
    *(undefined2 *)(pixel_stride_local + (long)(transform_local + (long)color) * 2) = local_56;
    *(undefined2 *)(pixel_stride_local + ((long)color + (long)transform_local * 2) * 2) = local_54;
    *(undefined2 *)(pixel_stride_local + ((long)color + (long)transform_local * 3) * 2) = local_52;
  }
  return;
}

Assistant:

void transform_quad_to_line(const quad<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                            const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> color{source[i]};
        const quad<PixelType> color_transformed(transform(color.v1 & mask, color.v2 & mask, color.v3 & mask),
                                                color.v4 & mask);

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
        destination[i + 3 * pixel_stride] = color_transformed.v4;
    }
}